

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod
          (ConversionStream *this,iterator *Token,iterator *ScopeStart,iterator *ScopeEnd)

{
  HLSL2GLSLConverterImpl *this_00;
  _List_node_base *p_Var1;
  bool bVar2;
  ConversionStream *pCVar3;
  HLSLObjectInfo *Args_6;
  int iVar4;
  uint uVar5;
  _List_node_base *p_Var6;
  const_iterator cVar7;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos;
  iterator iVar8;
  iterator *piVar9;
  TokenListType *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_7;
  allocator local_1f1;
  ConversionStream *local_1f0;
  string msg;
  Uint32 NumArguments;
  _List_node_base *local_188;
  String local_180;
  undefined1 *local_160;
  size_type local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  _Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
  local_140;
  HLSLObjectInfo *local_138;
  iterator *local_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  undefined1 *local_e8;
  size_type local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 *local_c8;
  size_type local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 *local_88;
  size_type local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  _List_node_base *local_48;
  _List_node_base *local_40;
  iterator ArgsListEndToken;
  
  Pos._M_node = Token->_M_node;
  piVar9 = ScopeEnd;
  if ((ScopeEnd->_M_node == Pos._M_node) ||
     (iVar4 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev), iVar4 != 0)) {
    FormatString<char[26],char[46]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DotToken != ScopeEnd && Token->Literal == \".\"",
               (char (*) [46])piVar9);
    piVar9 = (iterator *)0x6b6;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessObjectMethod",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6b6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  local_188 = (Pos._M_node)->_M_next;
  if ((local_188 == ScopeEnd->_M_node) || (*(int *)&local_188[1]._M_next != 0x13b)) {
    FormatString<char[26],char[70]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier",
               (char (*) [70])piVar9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessObjectMethod",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6b9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var6 = ScopeStart->_M_node;
  local_1f0 = this;
  local_130 = Token;
  local_40 = Pos._M_node;
  if ((p_Var6 != Pos._M_node) && (*(int *)&Pos._M_node[1]._M_next != 0x13b)) {
    do {
      Pos._M_node = (Pos._M_node)->_M_prev;
      uVar5 = *(int *)&Pos._M_node[1]._M_next - 0x136;
      if (((uVar5 < 5) && ((0x15U >> (uVar5 & 0x1f) & 1) != 0)) &&
         (Pos = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                          (ScopeStart,ScopeEnd,Pos), Token->_M_node == ScopeEnd->_M_node)) {
        FormatString<char[45]>(&msg,(char (*) [45])"Unable to find matching open square bracket.");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_180,local_1f0,Token,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessObjectMethod",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x6ca,&msg,(char (*) [2])0x83f885,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var6 = ScopeStart->_M_node;
    } while ((Pos._M_node != p_Var6) && (*(int *)&Pos._M_node[1]._M_next != 0x13b));
  }
  if (Pos._M_node != p_Var6) {
    local_138 = FindHLSLObject(local_1f0,(String *)&Pos._M_node[1]._M_prev);
    pCVar3 = local_1f0;
    if (((local_138 != (HLSLObjectInfo *)0x0) &&
        (local_48 = local_188->_M_next, local_48 != ScopeEnd->_M_node)) &&
       ((*(int *)&local_48[1]._M_next == 0x135 &&
        (ArgsListEndToken._M_node = local_48,
        NumArguments = CountFunctionArguments(local_1f0,&ArgsListEndToken,ScopeEnd),
        ArgsListEndToken._M_node != ScopeEnd->_M_node)))) {
      this_00 = pCVar3->m_Converter;
      std::__cxx11::string::string((string *)&local_180,(char *)local_188[1]._M_prev,&local_1f1);
      Args_6 = local_138;
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&msg,&local_138->GLSLType,&local_180,NumArguments);
      iVar8._M_node = local_40;
      Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37e1d4;
      cVar7 = std::
              _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this_00,(key_type *)&msg);
      if ((msg.field_2._M_allocated_capacity != 0) && ((long)msg.field_2._8_8_ < 0)) {
        Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37e1f1;
        operator_delete__((void *)msg.field_2._M_allocated_capacity);
      }
      msg.field_2._M_allocated_capacity = 0;
      msg.field_2._8_8_ = 0;
      if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
        Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37e20f;
        operator_delete__(msg._M_dataplus._M_p);
      }
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37e238;
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cVar7.
              super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
              ._M_cur != (__node_type *)0x0;
      local_140 = cVar7.
                  super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                  ._M_cur;
      if (cVar7.
          super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
          ._M_cur == (__node_type *)0x0) {
        FormatString<char[34],std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
                  (&msg,(Diligent *)"Unable to find function stub for ",
                   (char (*) [34])&Pos._M_node[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x91f766,
                   (char (*) [2])&local_188[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82e2c3,
                   (char (*) [2])&NumArguments,(uint *)" args). GLSL object type: ",
                   (char (*) [27])Args_6,Args_7);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p == &msg.field_2) {
          return bVar2;
        }
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        return bVar2;
      }
      local_160 = &local_150;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,",","");
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
      p_Var6 = local_48;
      msg._M_string_length = (long)&msg.field_2 + 8;
      msg._M_dataplus._M_p._0_4_ = 0x13f;
      if (local_160 != &local_150) {
        msg._M_string_length = (size_type)local_160;
      }
      msg.field_2._M_allocated_capacity = local_158;
      local_158 = 0;
      local_150 = 0;
      local_60 = 0;
      local_58 = 0;
      local_160 = &local_150;
      local_68 = &local_58;
      Parsing::HLSLTokenInfo::operator=((HLSLTokenInfo *)(local_48 + 1),(HLSLTokenInfo *)&msg);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
      }
      this_01 = &local_1f0->m_Tokens;
      while (p_Var6 != iVar8._M_node) {
        p_Var1 = (iVar8._M_node)->_M_next;
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        _M_erase(this_01,iVar8);
        iVar8._M_node = p_Var1;
      }
      local_1f0 = (ConversionStream *)this_01;
      std::__cxx11::string::string
                ((string *)&local_88,
                 *(char **)((long)&((local_140._M_cur)->
                                   super__Hash_node_value<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>
                                   ._M_storage._M_storage + 0x28),(allocator *)&local_180);
      std::__cxx11::string::string((string *)&local_a8,(char *)Pos._M_node[3]._M_prev,&local_1f1);
      msg._M_dataplus._M_p._0_4_ = 0x13b;
      msg._M_string_length = (long)&msg.field_2 + 8;
      if (local_88 != &local_78) {
        msg._M_string_length = (size_type)local_88;
      }
      msg.field_2._M_allocated_capacity = local_80;
      local_80 = 0;
      local_78 = 0;
      local_a0 = 0;
      local_98 = 0;
      local_a8 = &local_98;
      local_88 = &local_78;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_1f0,(const_iterator)Pos._M_node,(HLSLTokenInfo *)&msg);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
      std::__cxx11::string::operator=((string *)&Pos._M_node[3]._M_prev," ");
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"(","");
      local_108 = &local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
      msg._M_dataplus._M_p._0_4_ = 0x135;
      msg._M_string_length = (long)&msg.field_2 + 8;
      if (local_e8 != &local_d8) {
        msg._M_string_length = (size_type)local_e8;
      }
      msg.field_2._M_allocated_capacity = local_e0;
      local_e0 = 0;
      local_d8 = 0;
      local_100 = 0;
      local_f8 = 0;
      local_108 = &local_f8;
      local_e8 = &local_d8;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_1f0,(const_iterator)Pos._M_node,(HLSLTokenInfo *)&msg);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
      piVar9 = local_130;
      if (local_108 != &local_f8) {
        operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
      }
      iVar8._M_node = ArgsListEndToken._M_node;
      piVar9->_M_node = p_Var6;
      if (*(long *)((long)&((local_140._M_cur)->
                           super__Hash_node_value<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>
                           ._M_storage._M_storage + 0x50) == 0) {
        return bVar2;
      }
      std::__cxx11::string::string
                ((string *)&local_c8,
                 *(char **)((long)&((local_140._M_cur)->
                                   super__Hash_node_value<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>
                                   ._M_storage._M_storage + 0x48),(allocator *)&local_180);
      local_128 = &local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
      msg._M_dataplus._M_p._0_4_ = 0x143;
      msg._M_string_length = (long)&msg.field_2 + 8;
      if (local_c8 != &local_b8) {
        msg._M_string_length = (size_type)local_c8;
      }
      msg.field_2._M_allocated_capacity = local_c0;
      local_c0 = 0;
      local_b8 = 0;
      local_120 = 0;
      local_118 = 0;
      local_128 = &local_118;
      local_c8 = &local_b8;
      iVar8 = std::__cxx11::
              list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              ::emplace<Diligent::Parsing::HLSLTokenInfo>
                        ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                          *)local_1f0,iVar8._M_node,(HLSLTokenInfo *)&msg);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
      if (local_128 != &local_118) {
        operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
      }
      std::__cxx11::string::push_back((char)iVar8._M_node + '\x18');
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod(TokenListType::iterator&       Token,
                                                                   const TokenListType::iterator& ScopeStart,
                                                                   const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( ...
    //         ^
    //      DotToken
    auto DotToken = Token;
    VERIFY_EXPR(DotToken != ScopeEnd && Token->Literal == ".");
    auto MethodToken = DotToken;
    ++MethodToken;
    VERIFY_EXPR(MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier);
    // TestText.Sample( ...
    //          ^
    //     MethodToken
    auto IdentifierToken = DotToken;
    // m_Tokens contains dummy node at the beginning, so we can
    // check for ScopeStart to break the loop
    while (IdentifierToken != ScopeStart && IdentifierToken->Type != TokenType::Identifier)
    {
        --IdentifierToken;
        if (IdentifierToken->Type == TokenType::ClosingAngleBracket ||
            IdentifierToken->Type == TokenType::ClosingSquareBracket ||
            IdentifierToken->Type == TokenType::ClosingParen)
        {
            // TestText[idx[0]].Sample( ...
            //                ^
            IdentifierToken = Parsing::FindMatchingBracket(ScopeStart, ScopeEnd, IdentifierToken);
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching open square bracket.");
            // TestText[idx[0]].Sample( ...
            //         ^
        }
    }
    if (IdentifierToken == ScopeStart)
        return false;
    // TestTextArr[2].Sample( ...
    // ^
    // IdentifierToken

    // Try to find identifier
    const auto* pObjectInfo = FindHLSLObject(IdentifierToken->Literal);
    if (pObjectInfo == nullptr)
    {
        return false;
    }
    const auto& ObjectType = pObjectInfo->GLSLType;

    auto ArgsListStartToken = MethodToken;
    ++ArgsListStartToken;

    // TestText.Sample( ...
    //                ^
    //     ArgsListStartToken

    if (ArgsListStartToken == ScopeEnd || ArgsListStartToken->Type != TokenType::OpenParen)
        return false;
    auto   ArgsListEndToken = ArgsListStartToken;
    Uint32 NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);

    if (ArgsListEndToken == ScopeEnd)
        return false;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    //                                               ArgsListEndToken
    auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey(ObjectType, MethodToken->Literal.c_str(), NumArguments));
    if (StubIt == m_Converter.m_GLSLStubs.end())
    {
        LOG_ERROR_MESSAGE("Unable to find function stub for ", IdentifierToken->Literal, ".", MethodToken->Literal, "(", NumArguments, " args). GLSL object type: ", ObjectType);
        return false;
    }

    //            DotToken
    //               V
    // TestTextArr[2].Sample( TestTextArr_sampler, ...
    // ^                    ^
    // IdentifierToken      ArgsListStartToken

    *ArgsListStartToken = TokenInfo(TokenType::Comma, ",");
    // TestTextArr[2].Sample, TestTextArr_sampler, ...
    //               ^      ^
    //           DotToken  ArgsListStartToken

    m_Tokens.erase(DotToken, ArgsListStartToken);
    // TestTextArr[2], TestTextArr_sampler, ...
    // ^
    // IdentifierToken

    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::Identifier, StubIt->second.Name.c_str(), IdentifierToken->Delimiter.c_str()));
    IdentifierToken->Delimiter = " ";
    // FunctionStub TestTextArr[2], TestTextArr_sampler, ...
    //              ^
    //              IdentifierToken


    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::OpenParen, "("));
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //               ^
    //               IdentifierToken

    Token = ArgsListStartToken;
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //                             ^
    //                           Token

    // Nested function calls will be automatically processed:
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, TestTex.Sample(...
    //                             ^
    //                           Token


    // Add swizzling if there is any
    if (StubIt->second.Swizzle.length() > 0)
    {
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    );
        //                                                            ^
        //                                                     ArgsListEndToken

        auto SwizzleToken = m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, StubIt->second.Swizzle.c_str(), ""));
        SwizzleToken->Literal.push_back(static_cast<Char>('0' + pObjectInfo->NumComponents));
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    )_SWIZZLE4;
        //                                                                     ^
        //                                                            ArgsListEndToken
    }
    return true;
}